

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::prepareUniforms
          (LengthOfVectorAndMatrixTest *this,program *program)

{
  pointer ptVar1;
  TestError *this_00;
  GLuint n_columns;
  TYPES TVar2;
  GLuint n_rows;
  GLfloat *data;
  
  if (this->m_is_compute_program == false) {
    return;
  }
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_current_test_case_index;
  TVar2 = ptVar1->m_type;
  if (TVar2 == UINT) {
    n_rows = ptVar1->m_n_rows;
    TVar2 = UINT;
    data = (GLfloat *)prepareUniforms::uint_data;
  }
  else {
    if (TVar2 != INT) {
      if (TVar2 != FLOAT) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x3be0);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      n_columns = ptVar1->m_n_cols;
      n_rows = ptVar1->m_n_rows;
      data = prepareUniforms::float_data;
      TVar2 = FLOAT;
      goto LAB_009e2203;
    }
    n_rows = ptVar1->m_n_rows;
    TVar2 = INT;
    data = (GLfloat *)prepareUniforms::int_data;
  }
  n_columns = 1;
LAB_009e2203:
  Utils::program::uniform(program,"uni_variable",TVar2,n_columns,n_rows,data);
  return;
}

Assistant:

void LengthOfVectorAndMatrixTest::prepareUniforms(Utils::program& program)
{
	static const GLfloat float_value = 0.125;
	static const GLint   int_value   = -1;
	static const GLuint  uint_value  = 1;

	static const GLfloat float_data[16] = { float_value, float_value, float_value, float_value,
											float_value, float_value, float_value, float_value,
											float_value, float_value, float_value, float_value,
											float_value, float_value, float_value, float_value };

	static const GLint int_data[4] = { int_value, int_value, int_value, int_value };

	static const GLuint uint_data[4] = { uint_value, uint_value, uint_value, uint_value };

	if (false == m_is_compute_program)
	{
		return;
	}

	const testCase& test_case = m_test_cases[m_current_test_case_index];

	switch (test_case.m_type)
	{
	case Utils::FLOAT:
		program.uniform("uni_variable", Utils::FLOAT, test_case.m_n_cols, test_case.m_n_rows, float_data);
		break;
	case Utils::INT:
		program.uniform("uni_variable", Utils::INT, 1 /* columns */, test_case.m_n_rows, int_data);
		break;
	case Utils::UINT:
		program.uniform("uni_variable", Utils::UINT, 1 /* columns */, test_case.m_n_rows, uint_data);
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}